

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void absl::CheckForMutexCorruption(intptr_t v,char *label)

{
  int iVar1;
  SynchWaitParams *pSVar2;
  PerThreadSynch *pPVar3;
  uint uVar4;
  undefined8 extraout_RAX;
  PerThreadSynch *pPVar5;
  long lVar6;
  pthread_t __target_thread;
  ThreadIdentity *pTVar7;
  uint in_ECX;
  PerThreadSynch *pPVar8;
  intptr_t extraout_RDX;
  intptr_t iVar9;
  intptr_t extraout_RDX_00;
  PerThreadSynch *pPVar10;
  uint unaff_EBP;
  PerThreadSynch *pPVar11;
  synchronization_internal *this;
  intptr_t unaff_R12;
  ThreadIdentity *y;
  bool bVar12;
  double dVar13;
  undefined8 uStack_40;
  
  if ((((uint)v * 8 ^ 0x20) & (uint)v & 0x28) == 0) {
    return;
  }
  CheckForMutexCorruption();
  uStack_40._0_4_ = (int)extraout_RAX;
  y = (ThreadIdentity *)((SynchWaitParams *)label)->cv_word;
  if (y != (ThreadIdentity *)0x0) {
    ((SynchWaitParams *)label)->cv_word = (atomic<long> *)0x0;
    this = (synchronization_internal *)0x0;
    iVar9 = extraout_RDX;
    uStack_40 = extraout_RAX;
    do {
      pPVar8 = (y->per_thread_synch).next;
      if (((ulong)pPVar8 & 1) == 0) {
        LOCK();
        pPVar5 = (y->per_thread_synch).next;
        bVar12 = pPVar8 == pPVar5;
        if (bVar12) {
          (y->per_thread_synch).next = (PerThreadSynch *)((ulong)pPVar8 | 1);
          pPVar5 = pPVar8;
        }
        UNLOCK();
        if (bVar12) goto LAB_00142d97;
      }
      uVar4 = synchronization_internal::MutexDelay(this,1,(int)iVar9);
      this = (synchronization_internal *)(ulong)uVar4;
      iVar9 = extraout_RDX_00;
    } while( true );
  }
  y = (ThreadIdentity *)((SynchWaitParams *)label)->thread;
  pSVar2 = (y->per_thread_synch).waitp;
  unaff_R12 = extraout_RDX;
  if ((pSVar2 != (SynchWaitParams *)label && pSVar2 != (SynchWaitParams *)0x0) &&
     ((y->per_thread_synch).suppress_fatal_errors == false)) goto LAB_00143044;
  (y->per_thread_synch).waitp = (SynchWaitParams *)label;
  (y->per_thread_synch).skip = (PerThreadSynch *)0x0;
  (y->per_thread_synch).may_skip = true;
  (y->per_thread_synch).wake = false;
  (y->per_thread_synch).cond_waiter = (bool)((byte)(in_ECX >> 1) & 1);
  if ((in_ECX & 4) == 0) {
    pTVar7 = base_internal::CurrentThreadIdentityIfPresent();
    if (pTVar7 == (ThreadIdentity *)0x0) goto LAB_00143049;
    goto LAB_00142e35;
  }
LAB_00142ec7:
  if ((PerThreadSynch *)v == (PerThreadSynch *)0x0) {
    (y->per_thread_synch).next = &y->per_thread_synch;
    (y->per_thread_synch).readers = unaff_R12;
    (y->per_thread_synch).maybe_unlocking = false;
    goto LAB_00143022;
  }
  iVar1 = (y->per_thread_synch).priority;
  if (((PerThreadSynch *)v)->priority < iVar1) {
    pPVar8 = (PerThreadSynch *)v;
    if (((PerThreadSynch *)v)->maybe_unlocking == false) {
      do {
        pPVar10 = pPVar8;
        pPVar5 = pPVar10->next;
        pPVar11 = pPVar5->skip;
        pPVar8 = pPVar5;
        if (pPVar11 != (PerThreadSynch *)0x0) {
          pPVar3 = pPVar5;
          pPVar8 = pPVar11;
          for (pPVar11 = pPVar11->skip; pPVar11 != (PerThreadSynch *)0x0; pPVar11 = pPVar11->skip) {
            pPVar3->skip = pPVar11;
            pPVar3 = pPVar8;
            pPVar8 = pPVar11;
          }
          pPVar5->skip = pPVar8;
        }
      } while (iVar1 <= pPVar8->priority);
    }
    else {
      if (((SynchWaitParams *)label)->how != (MuHow)kExclusiveS) goto LAB_00142ee7;
      pPVar10 = (PerThreadSynch *)0x0;
      if (((SynchWaitParams *)label)->cond == (Condition *)0x0) {
        pPVar10 = (PerThreadSynch *)v;
      }
    }
  }
  else {
LAB_00142ee7:
    pPVar10 = (PerThreadSynch *)0x0;
  }
  if (pPVar10 == (PerThreadSynch *)0x0) {
    if ((((in_ECX & 1) == 0) || (iVar1 < ((PerThreadSynch *)v)->next->priority)) ||
       ((((PerThreadSynch *)v)->maybe_unlocking == true &&
        ((((SynchWaitParams *)label)->how != (MuHow)kExclusiveS ||
         (((SynchWaitParams *)label)->cond != (Condition *)0x0)))))) {
      (y->per_thread_synch).next = ((PerThreadSynch *)v)->next;
      ((PerThreadSynch *)v)->next = &y->per_thread_synch;
      (y->per_thread_synch).readers = ((PerThreadSynch *)v)->readers;
      (y->per_thread_synch).maybe_unlocking = ((PerThreadSynch *)v)->maybe_unlocking;
      if ((((PerThreadSynch *)v)->may_skip == true) &&
         (bVar12 = MuEquivalentWaiter((PerThreadSynch *)v,&y->per_thread_synch), bVar12)) {
        ((PerThreadSynch *)v)->skip = &y->per_thread_synch;
      }
      goto LAB_00143022;
    }
    (y->per_thread_synch).next = ((PerThreadSynch *)v)->next;
    ((PerThreadSynch *)v)->next = &y->per_thread_synch;
  }
  else {
    (y->per_thread_synch).next = pPVar10->next;
    pPVar10->next = &y->per_thread_synch;
    if ((pPVar10->skip != (PerThreadSynch *)0x0) &&
       (bVar12 = MuEquivalentWaiter(pPVar10,&y->per_thread_synch), !bVar12)) {
      Enqueue();
LAB_00143058:
      __assert_fail("s == Synch_GetPerThread()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x3aa,
                    "PerThreadSynch *absl::Enqueue(PerThreadSynch *, SynchWaitParams *, intptr_t, int)"
                   );
    }
    if (((pPVar10 != (PerThreadSynch *)v) && (pPVar10->may_skip == true)) &&
       (bVar12 = MuEquivalentWaiter(pPVar10,&y->per_thread_synch), bVar12)) {
      pPVar10->skip = &y->per_thread_synch;
    }
  }
  pPVar8 = (y->per_thread_synch).next;
  bVar12 = MuEquivalentWaiter(&y->per_thread_synch,pPVar8);
  if (bVar12) {
    (y->per_thread_synch).skip = pPVar8;
  }
LAB_00143022:
  (y->per_thread_synch).state._M_i = kQueued;
  return;
LAB_00142d97:
  pPVar8 = ((SynchWaitParams *)label)->thread;
  if (pPVar8->waitp == (SynchWaitParams *)0x0) {
    pPVar8->waitp = (SynchWaitParams *)label;
    pPVar10 = (PerThreadSynch *)((ulong)pPVar5 & 0xfffffffffffffffc);
    pPVar11 = pPVar8;
    if (pPVar10 != (PerThreadSynch *)0x0) {
      pPVar8->next = pPVar10->next;
      pPVar11 = pPVar10;
    }
    pPVar11->next = pPVar8;
    (pPVar8->state)._M_i = kQueued;
    (y->per_thread_synch).next =
         (PerThreadSynch *)((ulong)((uint)pPVar5 & 2) | (ulong)((SynchWaitParams *)label)->thread);
    return;
  }
  Enqueue();
  in_ECX = unaff_EBP;
LAB_00143044:
  Enqueue();
LAB_00143049:
  pTVar7 = synchronization_internal::CreateThreadIdentity();
LAB_00142e35:
  if (y != pTVar7) goto LAB_00143058;
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    lVar6 = rdtsc();
  }
  else {
    lVar6 = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  if ((y->per_thread_synch).next_priority_read_cycles < lVar6 >> 2) {
    __target_thread = pthread_self();
    uVar4 = pthread_getschedparam
                      (__target_thread,(int *)((long)&uStack_40 + 4),(sched_param *)&uStack_40);
    if (uVar4 == 0) {
      (y->per_thread_synch).priority = uStack_40._0_4_;
      dVar13 = base_internal::UnscaledCycleClock::Frequency();
      (y->per_thread_synch).next_priority_read_cycles = (lVar6 >> 2) + (long)(dVar13 * 0.25);
    }
    else {
      raw_log_internal::RawLog
                (kError,"mutex.cc",0x3b4,"pthread_getschedparam failed: %d",(ulong)uVar4);
    }
  }
  goto LAB_00142ec7;
}

Assistant:

static void CheckForMutexCorruption(intptr_t v, const char* label) {
  // Test for either of two situations that should not occur in v:
  //   kMuWriter and kMuReader
  //   kMuWrWait and !kMuWait
  const uintptr_t w = static_cast<uintptr_t>(v ^ kMuWait);
  // By flipping that bit, we can now test for:
  //   kMuWriter and kMuReader in w
  //   kMuWrWait and kMuWait in w
  // We've chosen these two pairs of values to be so that they will overlap,
  // respectively, when the word is left shifted by three.  This allows us to
  // save a branch in the common (correct) case of them not being coincident.
  static_assert(kMuReader << 3 == kMuWriter, "must match");
  static_assert(kMuWait << 3 == kMuWrWait, "must match");
  if (ABSL_PREDICT_TRUE((w & (w << 3) & (kMuWriter | kMuWrWait)) == 0)) return;
  RAW_CHECK_FMT((v & (kMuWriter | kMuReader)) != (kMuWriter | kMuReader),
                "%s: Mutex corrupt: both reader and writer lock held: %p",
                label, reinterpret_cast<void*>(v));
  RAW_CHECK_FMT((v & (kMuWait | kMuWrWait)) != kMuWrWait,
                "%s: Mutex corrupt: waiting writer with no waiters: %p", label,
                reinterpret_cast<void*>(v));
  assert(false);
}